

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_ManPatRareImprove(Gia_Man_t *p,int RareLimit,int fVerbose)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int i;
  abctime aVar4;
  word *p_00;
  float fVar5;
  float local_90;
  uint local_80;
  int VarBest;
  float PatQuo;
  Vec_Int_t *vBest;
  Vec_Flt_t *vQuoIncs;
  Vec_Int_t *vPat;
  Vec_Int_t *vRareCounts;
  abctime clk_1;
  Vec_Wrd_t *vPatterns;
  int nWords;
  int nChanges;
  int nRares;
  int n;
  float InitTotal;
  float FinalTotal;
  abctime clk;
  int fVerbose_local;
  int RareLimit_local;
  Gia_Man_t *p_local;
  
  clk._0_4_ = fVerbose;
  clk._4_4_ = RareLimit;
  _fVerbose_local = p;
  _InitTotal = Abc_Clock();
  nWords = 0;
  vPatterns._4_4_ = 0;
  iVar2 = Vec_WrdSize(_fVerbose_local->vSimsPi);
  iVar3 = Gia_ManCiNum(_fVerbose_local);
  vPatterns._0_4_ = iVar2 / iVar3;
  clk_1 = (abctime)_fVerbose_local->vSimsPi;
  _fVerbose_local->vSimsPi = (Vec_Wrd_t *)0x0;
  nRares = (int)Gia_ManPatGetTotalQuo(_fVerbose_local,clk._4_4_,(Vec_Wrd_t *)clk_1,(int)vPatterns);
  for (nChanges = 0; nChanges < (int)vPatterns * 0x40; nChanges = nChanges + 1) {
    vRareCounts = (Vec_Int_t *)Abc_Clock();
    vPat = Gia_SimCollectRare(_fVerbose_local,(Vec_Wrd_t *)clk_1,clk._4_4_);
    vQuoIncs = (Vec_Flt_t *)
               Gia_ManPatCollectOne(_fVerbose_local,(Vec_Wrd_t *)clk_1,nChanges,(int)vPatterns);
    vBest = (Vec_Int_t *)Gia_SimQualityImpact(_fVerbose_local,(Vec_Int_t *)vQuoIncs,vPat);
    _VarBest = Gia_SimCollectBest((Vec_Flt_t *)vBest);
    if ((int)clk != 0) {
      fVar5 = Gia_ManPatGetOneQuo(_fVerbose_local,clk._4_4_,(Vec_Wrd_t *)clk_1,(int)vPatterns,
                                  nChanges);
      iVar2 = nChanges;
      iVar3 = Vec_IntSize(vPat);
      if (_VarBest == (Vec_Int_t *)0x0) {
        local_80 = 0;
      }
      else {
        local_80 = Vec_IntSize(_VarBest);
      }
      pVVar1 = vBest;
      if (_VarBest == (Vec_Int_t *)0x0) {
        local_90 = 0.0;
      }
      else {
        i = Vec_IntEntry(_VarBest,0);
        local_90 = Vec_FltEntry((Vec_Flt_t *)pVVar1,i);
      }
      printf("Pat %5d : Rare = %4d  Cands = %3d  Value = %8.3f  Change = %8.3f  ",(double)fVar5,
             (double)local_90,(ulong)(uint)iVar2,(ulong)(uint)(iVar3 / 2),(ulong)local_80);
      aVar4 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar4 - (long)vRareCounts);
    }
    pVVar1 = _VarBest;
    if (_VarBest != (Vec_Int_t *)0x0) {
      iVar2 = rand();
      iVar3 = Vec_IntSize(_VarBest);
      iVar2 = Vec_IntEntry(pVVar1,iVar2 % iVar3);
      p_00 = Vec_WrdEntryP((Vec_Wrd_t *)clk_1,iVar2 * (int)vPatterns);
      Abc_TtXorBit(p_00,nChanges);
      vPatterns._4_4_ = vPatterns._4_4_ + 1;
    }
    iVar2 = Vec_IntSize(vPat);
    nWords = iVar2 / 2;
    Vec_IntFree(vPat);
    Vec_IntFree((Vec_Int_t *)vQuoIncs);
    Vec_FltFree((Vec_Flt_t *)vBest);
    Vec_IntFreeP((Vec_Int_t **)&VarBest);
  }
  if ((int)clk != 0) {
    printf("\n");
  }
  n = (int)Gia_ManPatGetTotalQuo(_fVerbose_local,clk._4_4_,(Vec_Wrd_t *)clk_1,(int)vPatterns);
  _fVerbose_local->vSimsPi = (Vec_Wrd_t *)clk_1;
  printf("Improved %d out of %d patterns using %d rare nodes: %.2f -> %.2f.  ",(double)(float)nRares
         ,(double)(float)n,(ulong)vPatterns._4_4_,(ulong)(uint)((int)vPatterns << 6),
         (ulong)(uint)nWords);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar4 - _InitTotal);
  return;
}

Assistant:

void Gia_ManPatRareImprove( Gia_Man_t * p, int RareLimit, int fVerbose )
{
    abctime clk = Abc_Clock();
    float FinalTotal, InitTotal;
    int n, nRares = 0, nChanges = 0, nWords = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    Vec_Wrd_t * vPatterns = p->vSimsPi; p->vSimsPi = NULL;
    InitTotal = Gia_ManPatGetTotalQuo( p, RareLimit, vPatterns, nWords );
    for ( n = 0; n < 64*nWords; n++ )
    {
        abctime clk = Abc_Clock();
        Vec_Int_t * vRareCounts = Gia_SimCollectRare( p, vPatterns, RareLimit );
        Vec_Int_t * vPat        = Gia_ManPatCollectOne( p, vPatterns, n, nWords );
        Vec_Flt_t * vQuoIncs    = Gia_SimQualityImpact( p, vPat, vRareCounts );
        Vec_Int_t * vBest       = Gia_SimCollectBest( vQuoIncs );
        if ( fVerbose )
        {
            float PatQuo = Gia_ManPatGetOneQuo( p, RareLimit, vPatterns, nWords, n );
            printf( "Pat %5d : Rare = %4d  Cands = %3d  Value = %8.3f  Change = %8.3f  ", 
                n, Vec_IntSize(vRareCounts)/2, vBest ? Vec_IntSize(vBest) : 0, 
                PatQuo, vBest ? Vec_FltEntry(vQuoIncs, Vec_IntEntry(vBest,0)) : 0 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( vBest != NULL )
        {
            int VarBest = Vec_IntEntry( vBest, rand()%Vec_IntSize(vBest) );
            Abc_TtXorBit( Vec_WrdEntryP(vPatterns, VarBest*nWords), n );
            nChanges++;
        }
        nRares = Vec_IntSize(vRareCounts)/2;
        Vec_IntFree( vRareCounts );
        Vec_IntFree( vPat );
        Vec_FltFree( vQuoIncs );
        Vec_IntFreeP( &vBest );
    }
    if ( fVerbose )
        printf( "\n" );
    FinalTotal = Gia_ManPatGetTotalQuo( p, RareLimit, vPatterns, nWords );
    p->vSimsPi = vPatterns;

    printf( "Improved %d out of %d patterns using %d rare nodes: %.2f -> %.2f.  ", 
        nChanges, 64*nWords, nRares, InitTotal, FinalTotal );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}